

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.hpp
# Opt level: O3

void njoy::tools::disco::Integer<11u>::write<long,std::back_insert_iterator<std::__cxx11::string>>
               (long *value,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *iter)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  ostringstream buffer;
  char local_1b8;
  undefined7 uStack_1b7;
  long local_1b0;
  long local_1a8 [2];
  long local_198 [2];
  undefined8 uStack_188;
  uint auStack_180 [22];
  ios_base local_128 [112];
  char acStack_b8 [152];
  
  uVar1 = *value;
  uVar3 = -uVar1;
  if (0 < (long)uVar1) {
    uVar3 = uVar1;
  }
  iVar4 = 1;
  if (9 < uVar3) {
    do {
      iVar4 = iVar4 + 1;
      bVar2 = 99 < uVar3;
      uVar3 = uVar3 / 10;
    } while (bVar2);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffff4f | 0x80;
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 0xb;
  if ((uint)(iVar4 - (int)((long)uVar1 >> 0x3f)) < 0xc) {
    std::ostream::_M_insert<long>((long)local_198);
  }
  else {
    lVar5 = *(long *)(local_198[0] + -0x18);
    if (acStack_b8[lVar5 + 1] == '\0') {
      std::ios::widen((char)&local_1b8 + (char)lVar5 + ' ');
      acStack_b8[lVar5 + 1] = '\x01';
    }
    acStack_b8[lVar5] = '*';
    local_1b8 = '*';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_1b8,1);
  }
  std::__cxx11::stringbuf::str();
  plVar6 = (long *)CONCAT71(uStack_1b7,local_1b8);
  if (local_1b0 != 0) {
    lVar5 = 0;
    do {
      std::__cxx11::string::push_back((char)iter->container);
      lVar5 = lVar5 + 1;
    } while (local_1b0 != lVar5);
    plVar6 = (long *)CONCAT71(uStack_1b7,local_1b8);
  }
  if (plVar6 != local_1a8) {
    operator_delete(plVar6,local_1a8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

static void write( const Representation& value, Iterator& iter ) {

    // std::abs does not exist for all integer types (e.g. unsigned)
    const Representation absValue = value < 0 ? -value : value;
    const auto required = minimumRequiredWidth( absValue )
                        + ( value < 0 ? 1 : 0 );

    std::ostringstream buffer;
    buffer << std::right << std::setw( Width );
    if ( required > Width ) {

      buffer << std::setfill( '*' ) << '*';
    }
    else {

      buffer << value;
    }

    for ( auto b : buffer.str() ) {

      *iter++ = b;
    }
  }